

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_ReadModule(BCReaderState *s)

{
  int *piVar1;
  JSContext *ctx;
  int iVar2;
  JSModuleDef *m;
  ulong uVar3;
  JSReqModuleEntry *pJVar4;
  JSExportEntry *pJVar5;
  JSStarExportEntry *pJVar6;
  JSImportEntry *pJVar7;
  ulong uVar8;
  int64_t iVar9;
  long lVar10;
  uint32_t *pval;
  uint uVar11;
  long lVar12;
  JSRefCountHeader *p;
  JSValue JVar13;
  uint8_t v8;
  JSAtom module_name;
  byte local_51;
  int *local_50;
  JSContext *local_48;
  JSAtom local_3c;
  long local_38;
  
  ctx = s->ctx;
  iVar2 = bc_get_atom(s,&local_3c);
  iVar9 = 6;
  if ((iVar2 == 0) && (m = js_new_module_def(ctx,local_3c), m != (JSModuleDef *)0x0)) {
    (m->header).ref_count = (m->header).ref_count + 1;
    piVar1 = &m->req_module_entries_count;
    local_48 = ctx;
    iVar2 = bc_get_leb128(s,(uint32_t *)piVar1);
    if (iVar2 == 0) {
      iVar2 = *piVar1;
      if ((long)iVar2 != 0) {
        m->req_module_entries_size = iVar2;
        pJVar4 = (JSReqModuleEntry *)js_mallocz(local_48,(long)iVar2 << 4);
        m->req_module_entries = pJVar4;
        if (pJVar4 == (JSReqModuleEntry *)0x0) goto LAB_0013c0b8;
        if (0 < *piVar1) {
          lVar10 = 0;
          lVar12 = 0;
          do {
            iVar2 = bc_get_atom(s,(JSAtom *)((long)&m->req_module_entries->module_name + lVar10));
            if (iVar2 != 0) goto LAB_0013c0b8;
            lVar12 = lVar12 + 1;
            lVar10 = lVar10 + 0x10;
          } while (lVar12 < *piVar1);
        }
      }
      local_50 = &m->export_entries_count;
      iVar2 = bc_get_leb128(s,(uint32_t *)local_50);
      if (iVar2 == 0) {
        iVar2 = *local_50;
        if ((long)iVar2 != 0) {
          m->export_entries_size = iVar2;
          pJVar5 = (JSExportEntry *)js_mallocz(local_48,(long)iVar2 << 5);
          m->export_entries = pJVar5;
          if (pJVar5 == (JSExportEntry *)0x0) goto LAB_0013c0b8;
          if (0 < *local_50) {
            lVar12 = 0x18;
            lVar10 = 0;
            do {
              pJVar5 = m->export_entries;
              iVar2 = bc_get_u8(s,&local_51);
              if (iVar2 != 0) goto LAB_0013c0b8;
              pval = (uint32_t *)(lVar12 + -0x18 + (long)pJVar5);
              uVar11 = (uint)local_51;
              pval[4] = uVar11;
              local_38 = lVar10;
              iVar2 = bc_get_leb128(s,pval);
              lVar10 = local_38;
              if (uVar11 != 0) {
                if (iVar2 != 0) goto LAB_0013c0b8;
                iVar2 = bc_get_atom(s,(JSAtom *)(lVar12 + -4 + (long)pJVar5));
              }
              if ((iVar2 != 0) ||
                 (iVar2 = bc_get_atom(s,(JSAtom *)((long)&pJVar5->u + lVar12)), iVar2 != 0))
              goto LAB_0013c0b8;
              lVar10 = lVar10 + 1;
              lVar12 = lVar12 + 0x20;
            } while (lVar10 < *local_50);
          }
        }
        piVar1 = &m->star_export_entries_count;
        iVar2 = bc_get_leb128(s,(uint32_t *)piVar1);
        if (iVar2 == 0) {
          iVar2 = *piVar1;
          if ((long)iVar2 != 0) {
            m->star_export_entries_size = iVar2;
            pJVar6 = (JSStarExportEntry *)js_mallocz(local_48,(long)iVar2 << 2);
            m->star_export_entries = pJVar6;
            if (pJVar6 == (JSStarExportEntry *)0x0) goto LAB_0013c0b8;
            if (0 < *piVar1) {
              lVar10 = 0;
              lVar12 = 0;
              do {
                iVar2 = bc_get_leb128(s,(uint32_t *)
                                        ((long)&m->star_export_entries->req_module_idx + lVar10));
                if (iVar2 != 0) goto LAB_0013c0b8;
                lVar12 = lVar12 + 1;
                lVar10 = lVar10 + 4;
              } while (lVar12 < *piVar1);
            }
          }
          local_50 = &m->import_entries_count;
          iVar2 = bc_get_leb128(s,(uint32_t *)local_50);
          if (iVar2 == 0) {
            iVar2 = *local_50;
            if ((long)iVar2 != 0) {
              m->import_entries_size = iVar2;
              pJVar7 = (JSImportEntry *)js_mallocz(local_48,(long)iVar2 * 0xc);
              m->import_entries = pJVar7;
              if (pJVar7 == (JSImportEntry *)0x0) goto LAB_0013c0b8;
              if (0 < *local_50) {
                lVar10 = 0;
                lVar12 = 0;
                do {
                  pJVar7 = m->import_entries;
                  iVar2 = bc_get_leb128(s,(uint32_t *)((long)&pJVar7->var_idx + lVar10));
                  if (((iVar2 != 0) ||
                      (iVar2 = bc_get_atom(s,(JSAtom *)((long)&pJVar7->import_name + lVar10)),
                      iVar2 != 0)) ||
                     (iVar2 = bc_get_leb128(s,(uint32_t *)((long)&pJVar7->req_module_idx + lVar10)),
                     iVar2 != 0)) goto LAB_0013c0b8;
                  lVar12 = lVar12 + 1;
                  lVar10 = lVar10 + 0xc;
                } while (lVar12 < *local_50);
              }
            }
            JVar13 = JS_ReadObjectRec(s);
            m->func_obj = JVar13;
            if ((int)JVar13.tag != 6) {
              uVar8 = (ulong)m & 0xffffffff00000000;
              uVar3 = (ulong)m & 0xffffffff;
              iVar9 = -3;
              goto LAB_0013c0c9;
            }
          }
        }
      }
    }
LAB_0013c0b8:
    js_free_module_def(local_48,m);
  }
  uVar3 = 0;
  uVar8 = 0;
LAB_0013c0c9:
  JVar13.u.ptr = (void *)(uVar3 | uVar8);
  JVar13.tag = iVar9;
  return JVar13;
}

Assistant:

static JSValue JS_ReadModule(BCReaderState *s)
{
    JSContext *ctx = s->ctx;
    JSValue obj;
    JSModuleDef *m = NULL;
    JSAtom module_name;
    int i;
    uint8_t v8;
    
    if (bc_get_atom(s, &module_name))
        goto fail;
#ifdef DUMP_READ_OBJECT
    bc_read_trace(s, "name: "); print_atom(s->ctx, module_name); printf("\n");
#endif
    m = js_new_module_def(ctx, module_name);
    if (!m)
        goto fail;
    obj = JS_DupValue(ctx, JS_MKPTR(JS_TAG_MODULE, m));
    if (bc_get_leb128_int(s, &m->req_module_entries_count))
        goto fail;
    if (m->req_module_entries_count != 0) {
        m->req_module_entries_size = m->req_module_entries_count;
        m->req_module_entries = js_mallocz(ctx, sizeof(m->req_module_entries[0]) * m->req_module_entries_size);
        if (!m->req_module_entries)
            goto fail;
        for(i = 0; i < m->req_module_entries_count; i++) {
            JSReqModuleEntry *rme = &m->req_module_entries[i];
            if (bc_get_atom(s, &rme->module_name))
                goto fail;
        }
    }

    if (bc_get_leb128_int(s, &m->export_entries_count))
        goto fail;
    if (m->export_entries_count != 0) {
        m->export_entries_size = m->export_entries_count;
        m->export_entries = js_mallocz(ctx, sizeof(m->export_entries[0]) * m->export_entries_size);
        if (!m->export_entries)
            goto fail;
        for(i = 0; i < m->export_entries_count; i++) {
            JSExportEntry *me = &m->export_entries[i];
            if (bc_get_u8(s, &v8))
                goto fail;
            me->export_type = v8;
            if (me->export_type == JS_EXPORT_TYPE_LOCAL) {
                if (bc_get_leb128_int(s, &me->u.local.var_idx))
                    goto fail;
            } else {
                if (bc_get_leb128_int(s, &me->u.req_module_idx))
                    goto fail;
                if (bc_get_atom(s, &me->local_name))
                    goto fail;
            }
            if (bc_get_atom(s, &me->export_name))
                goto fail;
        }
    }

    if (bc_get_leb128_int(s, &m->star_export_entries_count))
        goto fail;
    if (m->star_export_entries_count != 0) {
        m->star_export_entries_size = m->star_export_entries_count;
        m->star_export_entries = js_mallocz(ctx, sizeof(m->star_export_entries[0]) * m->star_export_entries_size);
        if (!m->star_export_entries)
            goto fail;
        for(i = 0; i < m->star_export_entries_count; i++) {
            JSStarExportEntry *se = &m->star_export_entries[i];
            if (bc_get_leb128_int(s, &se->req_module_idx))
                goto fail;
        }
    }

    if (bc_get_leb128_int(s, &m->import_entries_count))
        goto fail;
    if (m->import_entries_count != 0) {
        m->import_entries_size = m->import_entries_count;
        m->import_entries = js_mallocz(ctx, sizeof(m->import_entries[0]) * m->import_entries_size);
        if (!m->import_entries)
            goto fail;
        for(i = 0; i < m->import_entries_count; i++) {
            JSImportEntry *mi = &m->import_entries[i];
            if (bc_get_leb128_int(s, &mi->var_idx))
                goto fail;
            if (bc_get_atom(s, &mi->import_name))
                goto fail;
            if (bc_get_leb128_int(s, &mi->req_module_idx))
                goto fail;
        }
    }

    m->func_obj = JS_ReadObjectRec(s);
    if (JS_IsException(m->func_obj))
        goto fail;
    return obj;
 fail:
    if (m) {
        js_free_module_def(ctx, m);
    }
    return JS_EXCEPTION;
}